

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromisehelpers.h
# Opt level: O0

PromiseFromSignal<void_(Object::*)(int,_const_QString_&)>
QtPromise::connect<Object,void(Object::*)(int,QString_const&)>
          (Object *sender,offset_in_Object_to_subr signal)

{
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<int>_> extraout_RDX;
  PromiseFromSignal<void_(Object::*)(int,_const_QString_&)> PVar1;
  anon_class_16_2_a3c029ac local_48;
  offset_in_Object_to_subr local_38;
  offset_in_Object_to_subr signal_local;
  Object *local_28;
  Object *sender_local;
  Object *local_10;
  
  local_48.sender = &local_28;
  local_48.signal = &local_38;
  local_28 = (Object *)signal;
  local_10 = sender;
  QPromise<int>::
  QPromise<QtPromise::connect<Object,void(Object::*)(int,QString_const&)>(Object_const*,void(Object::*)(int,QString_const&))::_lambda(QtPromise::QPromiseResolve<int>const&,QtPromise::QPromiseReject<int>const&)_1_>
            ((QPromise<int> *)sender,&local_48);
  PVar1.super_QPromiseBase<int>.m_d.d = extraout_RDX.d;
  PVar1.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)sender;
  return (PromiseFromSignal<void_(Object::*)(int,_const_QString_&)>)PVar1.super_QPromiseBase<int>;
}

Assistant:

static inline typename QtPromisePrivate::PromiseFromSignal<Signal>
connect(const Sender* sender, Signal signal)
{
    using namespace QtPromisePrivate;
    using T = typename PromiseFromSignal<Signal>::Type;

    return QPromise<T>{[&](const QPromiseResolve<T>& resolve, const QPromiseReject<T>& reject) {
        QPromiseConnections connections;
        connectSignalToResolver(connections, resolve, sender, signal);
        connectDestroyedToReject(connections, reject, sender);
    }};
}